

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

void binbuf_addbinbuf(_binbuf *x,_binbuf *y)

{
  bool bVar1;
  _binbuf *x_00;
  t_symbol *ptVar2;
  char *local_420;
  char *s;
  char tbuf [1000];
  t_atom *ap;
  int fixit;
  int i;
  _binbuf *z;
  _binbuf *y_local;
  _binbuf *x_local;
  
  x_00 = binbuf_new();
  binbuf_add(x_00,y->b_n,y->b_vec);
  ap._4_4_ = 0;
  tbuf._992_8_ = x_00->b_vec;
  for (; ap._4_4_ < x_00->b_n; ap._4_4_ = ap._4_4_ + 1) {
    switch(*(undefined4 *)tbuf._992_8_) {
    case 1:
      break;
    case 2:
      bVar1 = false;
      for (local_420 = (char *)**(undefined8 **)(tbuf._992_8_ + 8); *local_420 != '\0';
          local_420 = local_420 + 1) {
        if ((((*local_420 == ';') || (*local_420 == ',')) || (*local_420 == '$')) ||
           (*local_420 == '\\')) {
          bVar1 = true;
        }
      }
      if (bVar1) {
        atom_string((t_atom *)tbuf._992_8_,(char *)&s,1000);
        *(undefined4 *)tbuf._992_8_ = 2;
        ptVar2 = gensym((char *)&s);
        *(t_symbol **)(tbuf._992_8_ + 8) = ptVar2;
      }
      break;
    default:
      bug("binbuf_addbinbuf");
      break;
    case 4:
      *(undefined4 *)tbuf._992_8_ = 2;
      ptVar2 = gensym(";");
      *(t_symbol **)(tbuf._992_8_ + 8) = ptVar2;
      break;
    case 5:
      *(undefined4 *)tbuf._992_8_ = 2;
      ptVar2 = gensym(",");
      *(t_symbol **)(tbuf._992_8_ + 8) = ptVar2;
      break;
    case 8:
      sprintf((char *)&s,"$%d",(ulong)*(uint *)(tbuf._992_8_ + 8));
      *(undefined4 *)tbuf._992_8_ = 2;
      ptVar2 = gensym((char *)&s);
      *(t_symbol **)(tbuf._992_8_ + 8) = ptVar2;
      break;
    case 9:
      atom_string((t_atom *)tbuf._992_8_,(char *)&s,1000);
      *(undefined4 *)tbuf._992_8_ = 2;
      ptVar2 = gensym((char *)&s);
      *(t_symbol **)(tbuf._992_8_ + 8) = ptVar2;
    }
    tbuf._992_8_ = tbuf._992_8_ + 0x10;
  }
  binbuf_add(x,x_00->b_n,x_00->b_vec);
  binbuf_free(x_00);
  return;
}

Assistant:

void binbuf_addbinbuf(t_binbuf *x, const t_binbuf *y)
{
    t_binbuf *z = binbuf_new();
    int i, fixit;
    t_atom *ap;
    binbuf_add(z, y->b_n, y->b_vec);
    for (i = 0, ap = z->b_vec; i < z->b_n; i++, ap++)
    {
        char tbuf[MAXPDSTRING];
        const char *s;
        switch (ap->a_type)
        {
        case A_FLOAT:
            break;
        case A_SEMI:
            SETSYMBOL(ap, gensym(";"));
            break;
        case A_COMMA:
            SETSYMBOL(ap, gensym(","));
            break;
        case A_DOLLAR:
            sprintf(tbuf, "$%d", ap->a_w.w_index);
            SETSYMBOL(ap, gensym(tbuf));
            break;
        case A_DOLLSYM:
            atom_string(ap, tbuf, MAXPDSTRING);
            SETSYMBOL(ap, gensym(tbuf));
            break;
        case A_SYMBOL:
            for (s = ap->a_w.w_symbol->s_name, fixit = 0; *s; s++)
                if (*s == ';' || *s == ',' || *s == '$' || *s == '\\')
                    fixit = 1;
            if (fixit)
            {
                atom_string(ap, tbuf, MAXPDSTRING);
                SETSYMBOL(ap, gensym(tbuf));
            }
            break;
        default:
            bug("binbuf_addbinbuf");
        }
    }

    binbuf_add(x, z->b_n, z->b_vec);
    binbuf_free(z);
}